

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qevdevkeyboardmanager.cpp
# Opt level: O2

void __thiscall QEvdevKeyboardManager::~QEvdevKeyboardManager(QEvdevKeyboardManager *this)

{
  *(undefined ***)this = &PTR_metaObject_001456d0;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->m_defaultKeymapFile).d);
  std::
  vector<QtInputSupport::DeviceHandlerList<QEvdevKeyboardHandler>::Device,_std::allocator<QtInputSupport::DeviceHandlerList<QEvdevKeyboardHandler>::Device>_>
  ::~vector(&(this->m_keyboards).v);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&(this->m_spec).d);
  QObject::~QObject(&this->super_QObject);
  return;
}

Assistant:

QEvdevKeyboardManager::~QEvdevKeyboardManager()
{
}